

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::checkGroupCount
          (DataDictionary *this,FieldBase *field,FieldMap *fieldMap,MsgType *msgType)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_t sVar4;
  RepeatingGroupCountMismatch *this_00;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  StringField *pSStack_28;
  int fieldNum;
  MsgType *msgType_local;
  FieldMap *fieldMap_local;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  pSStack_28 = &msgType->super_StringField;
  msgType_local = (MsgType *)fieldMap;
  fieldMap_local = (FieldMap *)field;
  field_local = (FieldBase *)this;
  local_2c = FieldBase::getTag(field);
  psVar3 = StringField::operator_cast_to_string_(pSStack_28);
  bVar1 = isGroup(this,psVar3,local_2c);
  if (bVar1) {
    sVar4 = FieldMap::groupCount((FieldMap *)msgType_local,local_2c);
    psVar3 = FieldBase::getString_abi_cxx11_((FieldBase *)fieldMap_local);
    iVar2 = IntTConvertor<int>::convert(psVar3);
    if ((int)sVar4 != iVar2) {
      this_00 = (RepeatingGroupCountMismatch *)__cxa_allocate_exception(0x58);
      iVar2 = local_2c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
      RepeatingGroupCountMismatch::RepeatingGroupCountMismatch(this_00,iVar2,&local_50);
      __cxa_throw(this_00,&RepeatingGroupCountMismatch::typeinfo,
                  RepeatingGroupCountMismatch::~RepeatingGroupCountMismatch);
    }
  }
  return;
}

Assistant:

EXCEPT(RepeatingGroupCountMismatch) {
    int fieldNum = field.getTag();
    if (isGroup(msgType, fieldNum)) {
      if ((int)fieldMap.groupCount(fieldNum) != IntConvertor::convert(field.getString())) {
        throw RepeatingGroupCountMismatch(fieldNum);
      }
    }
  }